

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O3

int MRIStepSetCoupling(void *arkode_mem,MRIStepCoupling MRIC)

{
  int iVar1;
  int iVar2;
  MRIStepCoupling MRIC_00;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  sunindextype Tliw;
  sunindextype Tlrw;
  ARKodeMRIStepMem local_40;
  ARKodeMem local_38;
  long local_30;
  long local_28;
  
  iVar2 = mriStep_AccessARKODEStepMem(arkode_mem,"MRIStepSetCoupling",&local_38,&local_40);
  if (iVar2 == 0) {
    if (MRIC == (MRIStepCoupling)0x0) {
      arkProcessError(local_38,-0x15,0x32,"MRIStepSetCoupling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep_io.c"
                      ,"The MRIStepCoupling is NULL.");
      iVar2 = -0x16;
    }
    else {
      local_40->stages = 0;
      iVar2 = 0;
      local_40->q = 0;
      local_40->p = 0;
      MRIStepCoupling_Space(local_40->MRIC,&local_30,&local_28);
      MRIStepCoupling_Free(local_40->MRIC);
      local_40->MRIC = (MRIStepCoupling)0x0;
      local_38->liw = local_38->liw - local_30;
      local_38->lrw = local_38->lrw - local_28;
      local_40->stages = MRIC->stages;
      iVar1 = MRIC->p;
      local_40->q = MRIC->q;
      local_40->p = iVar1;
      MRIC_00 = MRIStepCoupling_Copy(MRIC);
      local_40->MRIC = MRIC_00;
      if (MRIC_00 == (MRIStepCoupling)0x0) {
        iVar2 = -0x15;
        arkProcessError(local_38,-0x15,0x4a,"MRIStepSetCoupling",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep_io.c"
                        ,"The MRIStepCoupling is NULL.");
      }
      else {
        MRIStepCoupling_Space(MRIC_00,&local_30,&local_28);
        local_38->liw = local_38->liw + local_30;
        local_38->lrw = local_38->lrw + local_28;
      }
    }
  }
  return iVar2;
}

Assistant:

int MRIStepSetCoupling(void* arkode_mem, MRIStepCoupling MRIC)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  sunindextype Tlrw, Tliw;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* check for illegal inputs */
  if (MRIC == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_COUPLING);
    return (ARK_ILL_INPUT);
  }

  /* clear any existing parameters and coupling structure */
  step_mem->stages = 0;
  step_mem->q      = 0;
  step_mem->p      = 0;
  MRIStepCoupling_Space(step_mem->MRIC, &Tliw, &Tlrw);
  MRIStepCoupling_Free(step_mem->MRIC);
  step_mem->MRIC = NULL;
  ark_mem->liw -= Tliw;
  ark_mem->lrw -= Tlrw;

  /* set the relevant parameters */
  step_mem->stages = MRIC->stages;
  step_mem->q      = MRIC->q;
  step_mem->p      = MRIC->p;

  /* copy the coupling structure in step memory */
  step_mem->MRIC = MRIStepCoupling_Copy(MRIC);
  if (step_mem->MRIC == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_COUPLING);
    return (ARK_MEM_NULL);
  }
  MRIStepCoupling_Space(step_mem->MRIC, &Tliw, &Tlrw);
  ark_mem->liw += Tliw;
  ark_mem->lrw += Tlrw;

  return (ARK_SUCCESS);
}